

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# observer.hpp
# Opt level: O1

void __thiscall
baryonyx::details::pi_pnm_observer::make_observation<double>
          (pi_pnm_observer *this,sparse_matrix<int> *param_1,double *param_2,double *pi)

{
  _Head_base<0UL,_unsigned_char_*,_false> _Var1;
  rgb rVar2;
  ulong uVar3;
  colormap fct;
  colormap local_30;
  
  _Var1._M_head_impl =
       (this->m_pnm).m_buffer._M_t.
       super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
       super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
       super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
  local_30.m_lower = -1.0;
  local_30.m_upper = 1.0;
  if (this->constraints != 0) {
    uVar3 = 0;
    do {
      rVar2 = colormap::operator()(&local_30,pi[uVar3]);
      if (_Var1._M_head_impl == (uint8_t *)0x0) {
        make_observation<double>();
      }
      *_Var1._M_head_impl = rVar2.red;
      _Var1._M_head_impl[1] = rVar2.green;
      _Var1._M_head_impl[2] = rVar2.blue;
      uVar3 = uVar3 + 1;
    } while (uVar3 != (uint)this->constraints);
  }
  pnm_vector::flush(&this->m_pnm);
  return;
}

Assistant:

void make_observation(const sparse_matrix<int>& /*ap*/,
                          const Float* /*P*/,
                          const Float* pi)
    {
        static_assert(std::is_floating_point<Float>::value);

        auto it = m_pnm.begin();
        colormap fct(-1.f, +1.f);

        for (int i = 0; i != constraints; ++i)
            *it = fct(pi[i]);

        m_pnm.flush();
    }